

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

bool __thiscall
re2::Regexp::ParseState::ParseCharClass
          (ParseState *this,StringPiece *s,Regexp **out_re,RegexpStatus *status)

{
  char *pcVar1;
  const_pointer pcVar2;
  size_type sVar3;
  byte bVar4;
  bool bVar5;
  char cVar6;
  bool bVar7;
  ParseStatus PVar8;
  int iVar9;
  Regexp *this_00;
  CharClassBuilder *this_01;
  UGroup *pUVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  size_type sVar14;
  char *pcVar15;
  RuneRange rr;
  Rune r;
  StringPiece whole_class;
  StringPiece local_88;
  ParseFlags local_78;
  int local_74;
  CharClassBuilder *local_70;
  StringPiece *local_68;
  Regexp **local_60;
  Regexp *local_58;
  Rune local_4c;
  StringPiece local_48;
  
  local_48.data_ = s->data_;
  local_48.size_ = s->size_;
  if ((s->size_ == 0) || (*s->data_ != '[')) {
    status->code_ = kRegexpInternalError;
    (status->error_arg_).data_ = (const_pointer)0x0;
    (status->error_arg_).size_ = 0;
  }
  else {
    local_60 = out_re;
    this_00 = (Regexp *)operator_new(0x28);
    Regexp(this_00,kRegexpCharClass,
           this->flags_ &
           (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|NonGreedy|Latin1|
            OneLine|MatchNL|Literal));
    this_01 = (CharClassBuilder *)operator_new(0x40);
    CharClassBuilder::CharClassBuilder(this_01);
    (this_00->field_7).field_3.ccb_ = this_01;
    pcVar2 = s->data_;
    sVar3 = s->size_;
    pcVar15 = pcVar2 + 1;
    s->data_ = pcVar15;
    sVar14 = sVar3 - 1;
    s->size_ = sVar14;
    if ((sVar14 == 0) || (*pcVar15 != '^')) {
      bVar5 = false;
    }
    else {
      s->data_ = pcVar2 + 2;
      s->size_ = sVar3 - 2;
      bVar5 = true;
      if ((this->flags_ & (NeverNL|ClassNL)) != ClassNL) {
        CharClassBuilder::AddRange(this_01,10,10);
      }
    }
    uVar13 = s->size_;
    if (uVar13 != 0) {
      local_74 = 0x1c;
      local_68 = &status->error_arg_;
      pcVar15 = s->data_;
      cVar6 = *pcVar15;
      bVar4 = 1;
      local_58 = this_00;
      do {
        if (((!(bool)(cVar6 != '-' | bVar4)) && ((this->flags_ & PerlX) == NoParseFlags)) &&
           ((uVar13 == 1 || (pcVar15[1] != ']')))) {
          local_88.data_ = s->data_ + 1;
          local_88.size_ = s->size_ - 1;
          iVar9 = StringPieceToRune(&local_4c,&local_88,status);
          if (-1 < iVar9) {
            status->code_ = kRegexpBadCharRange;
            (status->error_arg_).data_ = s->data_;
            (status->error_arg_).size_ = (ulong)(iVar9 + 1);
          }
          goto LAB_00238d14;
        }
        if ((cVar6 == '[' && 2 < uVar13) && (pcVar15[1] == ':')) {
          iVar9 = 2;
          if ((1 < (long)uVar13) && (3 < (long)uVar13)) {
            lVar12 = -4;
            lVar11 = 2;
            bVar7 = false;
            do {
              if ((pcVar15[lVar11] == ':') && ((pcVar15 + 1)[lVar11] == ']')) {
                if (!bVar7) {
                  local_88.size_ = -lVar12;
                  local_88.data_ = pcVar15;
                  local_78 = this->flags_;
                  local_70 = (this_00->field_7).field_3.ccb_;
                  pUVar10 = LookupGroup(&local_88,(UGroup *)posix_groups,local_74);
                  if (pUVar10 == (UGroup *)0x0) {
                    status->code_ = kRegexpBadCharRange;
                    local_68->data_ = local_88.data_;
                    local_68->size_ = local_88.size_;
                    iVar9 = 1;
                  }
                  else {
                    s->data_ = pcVar15 + -lVar12;
                    s->size_ = uVar13 + lVar12;
                    AddUGroup(local_70,pUVar10,pUVar10->sign,local_78);
                    iVar9 = 0;
                  }
                }
                break;
              }
              lVar12 = lVar12 + -1;
              pcVar1 = pcVar15 + lVar11;
              lVar11 = lVar11 + 1;
              bVar7 = pcVar15 + uVar13 + -2 < pcVar1 + 1;
            } while (pcVar1 + 1 <= pcVar15 + uVar13 + -2);
          }
          this_00 = local_58;
          if (iVar9 != 0) {
            if (iVar9 != 1) goto LAB_00238c02;
            goto LAB_00238d14;
          }
        }
        else {
LAB_00238c02:
          if (((2 < s->size_) && (*s->data_ == '\\')) && ((byte)(s->data_[1] | 0x20U) == 0x70)) {
            PVar8 = ParseUnicodeGroup(s,this->flags_,(this_00->field_7).field_3.ccb_,status);
            if (PVar8 == kParseOk) goto LAB_00238cbe;
            if (PVar8 == kParseError) goto LAB_00238d14;
          }
          pUVar10 = MaybeParsePerlCCEscape(s,this->flags_);
          if (pUVar10 == (UGroup *)0x0) {
            local_88.data_ = (char *)0x0;
            bVar7 = ParseCCRange(this,s,(RuneRange *)&local_88,&local_48,status);
            if (bVar7) {
              CharClassBuilder::AddRangeFlags
                        ((this_00->field_7).field_3.ccb_,(Rune)local_88.data_,local_88.data_._4_4_,
                         this->flags_ | ClassNL);
              bVar7 = false;
            }
            else {
              Decref(this_00);
              bVar7 = true;
            }
          }
          else {
            AddUGroup((this_00->field_7).field_3.ccb_,pUVar10,pUVar10->sign,this->flags_);
            bVar7 = false;
          }
          if (bVar7) {
            return false;
          }
        }
LAB_00238cbe:
        uVar13 = s->size_;
        if (uVar13 == 0) goto LAB_00238d03;
        pcVar15 = s->data_;
        cVar6 = *pcVar15;
        bVar4 = 0;
      } while (cVar6 != ']');
      if (uVar13 != 0) {
        s->data_ = s->data_ + 1;
        s->size_ = uVar13 - 1;
        if (bVar5) {
          CharClassBuilder::Negate((this_00->field_7).field_3.ccb_);
        }
        *local_60 = this_00;
        return true;
      }
    }
LAB_00238d03:
    status->code_ = kRegexpMissingBracket;
    (status->error_arg_).data_ = local_48.data_;
    (status->error_arg_).size_ = local_48.size_;
LAB_00238d14:
    Decref(this_00);
  }
  return false;
}

Assistant:

bool Regexp::ParseState::ParseCharClass(StringPiece* s,
                                        Regexp** out_re,
                                        RegexpStatus* status) {
  StringPiece whole_class = *s;
  if (s->empty() || (*s)[0] != '[') {
    // Caller checked this.
    status->set_code(kRegexpInternalError);
    status->set_error_arg(StringPiece());
    return false;
  }
  bool negated = false;
  Regexp* re = new Regexp(kRegexpCharClass, flags_ & ~FoldCase);
  re->ccb_ = new CharClassBuilder;
  s->remove_prefix(1);  // '['
  if (!s->empty() && (*s)[0] == '^') {
    s->remove_prefix(1);  // '^'
    negated = true;
    if (!(flags_ & ClassNL) || (flags_ & NeverNL)) {
      // If NL can't match implicitly, then pretend
      // negated classes include a leading \n.
      re->ccb_->AddRange('\n', '\n');
    }
  }
  bool first = true;  // ] is okay as first char in class
  while (!s->empty() && ((*s)[0] != ']' || first)) {
    // - is only okay unescaped as first or last in class.
    // Except that Perl allows - anywhere.
    if ((*s)[0] == '-' && !first && !(flags_&PerlX) &&
        (s->size() == 1 || (*s)[1] != ']')) {
      StringPiece t = *s;
      t.remove_prefix(1);  // '-'
      Rune r;
      int n = StringPieceToRune(&r, &t, status);
      if (n < 0) {
        re->Decref();
        return false;
      }
      status->set_code(kRegexpBadCharRange);
      status->set_error_arg(StringPiece(s->data(), 1+n));
      re->Decref();
      return false;
    }
    first = false;

    // Look for [:alnum:] etc.
    if (s->size() > 2 && (*s)[0] == '[' && (*s)[1] == ':') {
      switch (ParseCCName(s, flags_, re->ccb_, status)) {
        case kParseOk:
          continue;
        case kParseError:
          re->Decref();
          return false;
        case kParseNothing:
          break;
      }
    }

    // Look for Unicode character group like \p{Han}
    if (s->size() > 2 &&
        (*s)[0] == '\\' &&
        ((*s)[1] == 'p' || (*s)[1] == 'P')) {
      switch (ParseUnicodeGroup(s, flags_, re->ccb_, status)) {
        case kParseOk:
          continue;
        case kParseError:
          re->Decref();
          return false;
        case kParseNothing:
          break;
      }
    }

    // Look for Perl character class symbols (extension).
    const UGroup *g = MaybeParsePerlCCEscape(s, flags_);
    if (g != NULL) {
      AddUGroup(re->ccb_, g, g->sign, flags_);
      continue;
    }

    // Otherwise assume single character or simple range.
    RuneRange rr;
    if (!ParseCCRange(s, &rr, whole_class, status)) {
      re->Decref();
      return false;
    }
    // AddRangeFlags is usually called in response to a class like
    // \p{Foo} or [[:foo:]]; for those, it filters \n out unless
    // Regexp::ClassNL is set.  In an explicit range or singleton
    // like we just parsed, we do not filter \n out, so set ClassNL
    // in the flags.
    re->ccb_->AddRangeFlags(rr.lo, rr.hi, flags_ | Regexp::ClassNL);
  }
  if (s->empty()) {
    status->set_code(kRegexpMissingBracket);
    status->set_error_arg(whole_class);
    re->Decref();
    return false;
  }
  s->remove_prefix(1);  // ']'

  if (negated)
    re->ccb_->Negate();

  *out_re = re;
  return true;
}